

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::EachMatcher<iutest::detail::KeyMatcher<iutest::detail::LeMatcher<int>>>::operator()
          (AssertionResult *__return_storage_ptr__,
          EachMatcher<iutest::detail::KeyMatcher<iutest::detail::LeMatcher<int>>> *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *actual)

{
  bool bVar1;
  AssertionResult *rhs;
  string local_78;
  AssertionResult local_58;
  _Base_ptr local_30;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_28;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_20;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *actual_local;
  EachMatcher<iutest::detail::KeyMatcher<iutest::detail::LeMatcher<int>_>_> *this_local;
  
  local_20 = actual;
  actual_local = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)this;
  this_local = (EachMatcher<iutest::detail::KeyMatcher<iutest::detail::LeMatcher<int>_>_> *)
               __return_storage_ptr__;
  local_28._M_node =
       (_Base_ptr)
       std::begin<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>(actual)
  ;
  local_30 = (_Base_ptr)
             std::end<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
                       (local_20);
  bVar1 = Each<std::_Rb_tree_const_iterator<std::pair<int_const,int>>>
                    (this,local_28,(_Rb_tree_const_iterator<std::pair<const_int,_int>_>)local_30);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_78,this);
    rhs = AssertionResult::operator<<(&local_58,&local_78);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_78);
    AssertionResult::~AssertionResult(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Each(begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }